

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O3

int libssh2_knownhost_readline(LIBSSH2_KNOWNHOSTS *hosts,char *line,size_t len,int type)

{
  int iVar1;
  size_t hostlen;
  char *errmsg;
  char cVar2;
  LIBSSH2_SESSION *session;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  
  if (type == 1) {
    if (len != 0) {
      uVar3 = 0;
      sVar5 = len;
      do {
        uVar4 = (ulong)(byte)line[uVar3];
        if (0x23 < uVar4) {
LAB_001195b9:
          hostlen = 0;
          goto LAB_001195d2;
        }
        if ((0x100000200U >> (uVar4 & 0x3f) & 1) == 0) {
          if ((0x800000401U >> (uVar4 & 0x3f) & 1) != 0) {
            return 0;
          }
          goto LAB_001195b9;
        }
        sVar5 = sVar5 - 1;
        uVar3 = uVar3 + 1;
      } while (len != uVar3);
    }
    return 0;
  }
  session = hosts->session;
  errmsg = "Unsupported type of known-host information store";
  goto LAB_00119590;
LAB_001195d2:
  if (((byte)uVar4 < 0x21) && ((0x100000201U >> (uVar4 & 0x3f) & 1) != 0)) {
    uVar4 = uVar3 + hostlen;
    goto LAB_001195fd;
  }
  if (~uVar3 + len == hostlen) goto LAB_0011961a;
  uVar4 = (ulong)(byte)line[uVar3 + 1 + hostlen];
  hostlen = hostlen + 1;
  goto LAB_001195d2;
LAB_00119639:
  if ((cVar2 == '\0') || (cVar2 == '\n')) goto LAB_0011965c;
  if (~uVar4 + len == lVar6) {
    cVar2 = line[(sVar5 - hostlen) + uVar3 + hostlen];
LAB_0011965c:
    iVar1 = hostline(hosts,line + uVar3,hostlen,line + uVar4,(len - (cVar2 == '\n')) - uVar4);
    return iVar1;
  }
  cVar2 = line[uVar4 + 1 + lVar6];
  lVar6 = lVar6 + 1;
  goto LAB_00119639;
  while (uVar4 = uVar4 + 1, len != uVar4) {
LAB_001195fd:
    cVar2 = line[uVar4];
    if ((cVar2 != '\t') && (cVar2 != ' ')) {
      if (cVar2 != '\0') {
        lVar6 = 0;
        goto LAB_00119639;
      }
      break;
    }
  }
LAB_0011961a:
  session = hosts->session;
  errmsg = "Failed to parse known_hosts line";
LAB_00119590:
  iVar1 = _libssh2_error(session,-0x21,errmsg);
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_readline(LIBSSH2_KNOWNHOSTS *hosts,
                           const char *line, size_t len, int type)
{
    const char *cp;
    const char *hostp;
    const char *keyp;
    size_t hostlen;
    size_t keylen;
    int rc;

    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    cp = line;

    /* skip leading whitespaces */
    while(len && ((*cp == ' ') || (*cp == '\t'))) {
        cp++;
        len--;
    }

    if(!len || !*cp || (*cp == '#') || (*cp == '\n'))
        /* comment or empty line */
        return LIBSSH2_ERROR_NONE;

    /* the host part starts here */
    hostp = cp;

    /* move over the host to the separator */
    while(len && *cp && (*cp != ' ') && (*cp != '\t')) {
        cp++;
        len--;
    }

    hostlen = cp - hostp;

    /* the key starts after the whitespaces */
    while(len && *cp && ((*cp == ' ') || (*cp == '\t'))) {
        cp++;
        len--;
    }

    if(!*cp || !len) /* illegal line */
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Failed to parse known_hosts line");

    keyp = cp; /* the key starts here */
    keylen = len;

    /* check if the line (key) ends with a newline and if so kill it */
    while(len && *cp && (*cp != '\n')) {
        cp++;
        len--;
    }

    /* zero terminate where the newline is */
    if(*cp == '\n')
        keylen--; /* don't include this in the count */

    /* deal with this one host+key line */
    rc = hostline(hosts, hostp, hostlen, keyp, keylen);
    if(rc)
        return rc; /* failed */

    return LIBSSH2_ERROR_NONE; /* success */
}